

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external.c
# Opt level: O3

int vrna_E_ext_loop_3(vrna_fold_compound_t *fc,int i)

{
  ushort uVar1;
  ushort uVar2;
  short sVar3;
  vrna_hc_t *pvVar4;
  vrna_sc_t *pvVar5;
  vrna_sc_t **ppvVar6;
  vrna_ud_t *pvVar7;
  vrna_param_t *pvVar8;
  short *psVar9;
  char **ppcVar10;
  uint *puVar11;
  char *pcVar12;
  short **ppsVar13;
  uint **ppuVar14;
  undefined1 *puVar15;
  undefined1 *puVar16;
  uchar uVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  code *evaluate;
  long lVar25;
  int *piVar26;
  long lVar27;
  long lVar28;
  void *pvVar29;
  void *pvVar30;
  void *pvVar31;
  ulong uVar32;
  undefined2 uVar33;
  int turn;
  int iVar34;
  int iVar35;
  int iVar36;
  ulong uVar37;
  long lVar38;
  uint uVar39;
  int iVar40;
  uint uVar41;
  int (*paiVar42) [5];
  long lVar43;
  int iVar44;
  uint uVar45;
  code *pcVar46;
  int (*paaiVar47) [5] [5];
  int iVar48;
  code *pcVar49;
  int iVar50;
  long lVar51;
  ulong uVar52;
  ulong uVar53;
  long lVar54;
  long lVar55;
  long lVar56;
  bool bVar57;
  sc_wrapper_f3 sc_wrapper;
  default_data hc_dat_local;
  int local_10c;
  sc_wrapper_f3 local_e8;
  code *local_80;
  int local_78;
  int local_74;
  default_data local_70;
  int (*local_38) [5];
  
  if (fc == (vrna_fold_compound_t *)0x0) {
    return 10000000;
  }
  uVar53 = (ulong)(uint)i;
  iVar20 = (fc->params->model_details).dangles;
  local_74 = (fc->params->model_details).gquad;
  local_70.sn = fc->strand_number;
  pvVar4 = fc->hc;
  local_70.mx_window = (uchar **)(pvVar4->field_3).field_0.matrix;
  local_70.hc_up = pvVar4->up_ext;
  if (pvVar4->f == (vrna_callback_hc_evaluate *)0x0) {
    evaluate = hc_default_window;
  }
  else {
    local_70.hc_dat = pvVar4->data;
    evaluate = hc_default_user_window;
    local_70.hc_f = pvVar4->f;
  }
  local_e8.n = fc->length;
  local_e8.n_seq = 1;
  local_e8.up = (int **)0x0;
  local_e8.red_ext = (code *)0x0;
  local_e8.red_stem = (code *)0x0;
  local_e8.decomp_stem = (code *)0x0;
  local_e8.decomp_stem1 = (code *)0x0;
  local_e8.user_cb = (vrna_callback_sc_energy *)0x0;
  local_e8.user_data = (void *)0x0;
  local_e8.up_comparative = (int ***)0x0;
  local_e8.user_cb_comparative = (vrna_callback_sc_energy **)0x0;
  local_e8.user_data_comparative = (void **)0x0;
  if (fc->type == VRNA_FC_TYPE_COMPARATIVE) {
    ppvVar6 = (fc->field_23).field_1.scs;
    local_e8.n_seq = (fc->field_23).field_1.n_seq;
    local_e8.a2s = (fc->field_23).field_1.a2s;
    if (ppvVar6 == (vrna_sc_t **)0x0) goto LAB_0011c3d6;
    local_e8.up_comparative = (int ***)vrna_alloc(local_e8.n_seq << 3);
    local_e8.user_cb_comparative =
         (vrna_callback_sc_energy **)vrna_alloc((fc->field_23).field_1.n_seq << 3);
    local_e8.user_data_comparative = (void **)vrna_alloc((fc->field_23).field_1.n_seq << 3);
    uVar45 = (fc->field_23).field_1.n_seq;
    pcVar46 = (code *)0x0;
    pcVar49 = pcVar46;
    if (uVar45 != 0) {
      uVar37 = 0;
      bVar57 = false;
      do {
        if (ppvVar6[uVar37] != (vrna_sc_t *)0x0) {
          local_e8.up_comparative[uVar37] = ppvVar6[uVar37]->energy_up;
          local_e8.user_cb_comparative[uVar37] = ppvVar6[uVar37]->f;
          local_e8.user_data_comparative[uVar37] = ppvVar6[uVar37]->data;
          if (ppvVar6[uVar37]->energy_up != (int **)0x0) {
            bVar57 = true;
          }
          if (ppvVar6[uVar37]->f != (vrna_callback_sc_energy *)0x0) {
            pcVar46 = (code *)0x1;
          }
          uVar45 = (fc->field_23).field_1.n_seq;
        }
        uVar37 = uVar37 + 1;
      } while (uVar37 < uVar45);
      if (bVar57) {
        bVar57 = (int)pcVar46 == 0;
        pcVar49 = sc_user_def_f3_reduce_to_ext_comparative;
        if (bVar57) {
          pcVar49 = sc_default_f3_reduce_comparative;
        }
        local_e8.red_stem = sc_user_def_f3_reduce_to_stem_comparative;
        if (bVar57) {
          local_e8.red_stem = sc_default_f3_reduce_comparative;
        }
        local_e8.decomp_stem = sc_user_def_f3_split_in_stem_ext_comparative;
        if (bVar57) {
          local_e8.decomp_stem = sc_default_f3_split_in_stem_ext_comparative;
        }
        pcVar46 = sc_default_f3_split_in_stem_ext1_comparative;
        local_e8.decomp_stem1 = sc_user_def_f3_split_in_stem_ext1_comparative;
        goto LAB_0011c38d;
      }
      pcVar49 = (code *)local_e8.red_ext;
      if ((int)pcVar46 != 0) {
        local_e8.decomp_stem1 = sc_user_f3_split_in_stem_ext1_comparative;
        local_e8.decomp_stem = sc_user_f3_split_in_stem_ext_comparative;
        local_e8.red_stem = sc_user_f3_reduce_to_stem_comparative;
        pcVar49 = sc_user_f3_reduce_to_ext_comparative;
        local_e8.red_ext = pcVar49;
      }
    }
  }
  else {
    pcVar49 = (code *)0x0;
    if (fc->type == VRNA_FC_TYPE_SINGLE) {
      pvVar5 = (fc->field_23).field_0.sc;
      if (pvVar5 == (vrna_sc_t *)0x0) {
LAB_0011c3d6:
        pcVar49 = (code *)0x0;
      }
      else {
        local_e8.up = pvVar5->energy_up;
        local_e8.user_cb = pvVar5->f;
        local_e8.user_data = pvVar5->data;
        if (local_e8.up == (int **)0x0) {
          if (local_e8.user_cb == (vrna_callback_sc_energy *)0x0) goto LAB_0011c3d6;
          local_e8.decomp_stem1 = sc_user_f3_split_in_stem_ext1;
          local_e8.decomp_stem = sc_user_f3_split_in_stem_ext;
          local_e8.red_stem = sc_user_f3_reduce_to_stem;
          pcVar49 = sc_user_f3_reduce_to_ext;
          local_e8.red_ext = pcVar49;
        }
        else {
          bVar57 = local_e8.user_cb == (vrna_callback_sc_energy *)0x0;
          pcVar49 = sc_user_def_f3_reduce_to_ext;
          if (bVar57) {
            pcVar49 = sc_default_f3_reduce;
          }
          local_e8.red_stem = sc_user_def_f3_reduce_to_stem;
          if (bVar57) {
            local_e8.red_stem = sc_default_f3_reduce;
          }
          local_e8.decomp_stem = sc_user_def_f3_split_in_stem_ext;
          if (bVar57) {
            local_e8.decomp_stem = sc_default_f3_split_in_stem_ext;
          }
          pcVar46 = sc_default_f3_split_in_stem_ext1;
          local_e8.decomp_stem1 = sc_user_def_f3_split_in_stem_ext1;
LAB_0011c38d:
          local_e8.red_ext = pcVar49;
          if (bVar57) {
            local_e8.decomp_stem1 = pcVar46;
          }
        }
      }
    }
  }
  uVar45 = fc->length;
  piVar26 = (fc->matrices->field_2).field_0.f5;
  pvVar7 = fc->domains_up;
  lVar25 = (long)i;
  uVar37 = lVar25 + 1;
  local_10c = 10000000;
  iVar48 = (int)uVar37;
  if (((piVar26[lVar25 + 1] != 10000000) &&
      (uVar17 = (*evaluate)(i,uVar45,iVar48,uVar45,'\f',&local_70), uVar17 != '\0')) &&
     (local_10c = piVar26[uVar37], pcVar49 != (code *)0x0)) {
    iVar18 = (*pcVar49)(uVar53,uVar37 & 0xffffffff,uVar45,&local_e8);
    local_10c = local_10c + iVar18;
  }
  if (((pvVar7 != (vrna_ud_t *)0x0) && (pvVar7->energy_cb != (vrna_callback_ud_energy *)0x0)) &&
     (0 < pvVar7->uniq_motif_count)) {
    lVar51 = 0;
    do {
      uVar52 = (int)pvVar7->uniq_motif_size[lVar51] + lVar25;
      iVar18 = (int)uVar52 + -1;
      if (((iVar18 <= (int)uVar45) && (piVar26[uVar52] != 10000000)) &&
         (uVar17 = (*evaluate)(i,uVar45,iVar18,uVar45,'\f',&local_70), uVar17 != '\0')) {
        iVar19 = piVar26[uVar52];
        iVar18 = (*pvVar7->energy_cb)(fc,i,iVar18,0x11,pvVar7->data);
        iVar18 = iVar18 + iVar19;
        if (pcVar49 != (code *)0x0) {
          iVar19 = (*pcVar49)(uVar53,uVar52 & 0xffffffff,uVar45,&local_e8);
          iVar18 = iVar18 + iVar19;
        }
        if (iVar18 <= local_10c) {
          local_10c = iVar18;
        }
      }
      lVar51 = lVar51 + 1;
    } while (lVar51 < pvVar7->uniq_motif_count);
  }
  uVar45 = fc->length;
  uVar52 = (ulong)uVar45;
  iVar18 = fc->window_size;
  lVar51 = (long)(int)uVar45;
  if (iVar20 == 2) {
    pvVar8 = fc->params;
    lVar43 = *(long *)((fc->matrices->field_2).field_0.c + lVar25 * 2);
    lVar27 = lVar43 + lVar25 * -4;
    iVar20 = (pvVar8->model_details).min_loop_size;
    pvVar29 = vrna_alloc(iVar18 * 4 + 0x18);
    puVar16 = local_e8.decomp_stem;
    puVar15 = local_e8.red_stem;
    if (fc->type == VRNA_FC_TYPE_SINGLE) {
      psVar9 = (fc->field_23).field_0.sequence_encoding;
      uVar23 = 0xffffffff;
      if (1 < i) {
        uVar23 = (uint)psVar9[uVar53 - 1];
      }
      ppcVar10 = fc->ptype_local;
      uVar24 = iVar18 + i;
      uVar22 = uVar45 - 1;
      if ((int)uVar24 < (int)uVar45) {
        uVar22 = uVar24;
      }
      iVar19 = iVar20 + iVar48;
      if (iVar19 <= (int)uVar22) {
        lVar54 = (long)iVar19;
        lVar28 = lVar54 + -1;
        lVar55 = lVar54 * 4 + lVar25 * -4;
        lVar43 = lVar43 + lVar55;
        lVar56 = 0;
        do {
          *(undefined4 *)((long)pvVar29 + lVar56 * 4 + lVar55) = 10000000;
          if (*(int *)(lVar43 + lVar56 * 4) != 10000000) {
            iVar50 = iVar20 + i + (int)lVar56 + 1;
            uVar17 = (*evaluate)(i,uVar45,iVar50,iVar20 + i + 2 + (int)lVar56,'\x10',&local_70);
            if (uVar17 != '\0') {
              uVar41 = vrna_get_ptype_window(i,iVar50,ppcVar10);
              sVar3 = psVar9[lVar54 + lVar56 + 1];
              uVar39 = (uint)sVar3;
              if ((int)(uVar23 | uVar39) < 0) {
                if (-1 < (int)uVar23) {
                  piVar26 = pvVar8->dangle5[uVar41] + uVar23;
                  goto LAB_0011d02f;
                }
                if (-1 < sVar3) {
                  piVar26 = pvVar8->dangle3[uVar41] + uVar39;
                  goto LAB_0011d02f;
                }
                iVar50 = 0;
              }
              else {
                piVar26 = pvVar8->mismatchExt[uVar41][uVar23] + uVar39;
LAB_0011d02f:
                iVar50 = *piVar26;
              }
              if (2 < uVar41) {
                iVar50 = iVar50 + pvVar8->TerminalAU;
              }
              *(int *)((long)pvVar29 + lVar56 * 4 + lVar55) = iVar50 + *(int *)(lVar43 + lVar56 * 4)
              ;
            }
          }
          lVar38 = lVar28 + lVar56;
          lVar56 = lVar56 + 1;
        } while (lVar38 + 1 < (long)(int)uVar22);
        if ((code *)puVar16 != (code *)0x0) {
          do {
            if (*(int *)((long)pvVar29 + lVar28 * 4 + lVar25 * -4 + 4) != 10000000) {
              iVar20 = (*(code *)puVar16)(uVar53,iVar19,iVar19 + 1,&local_e8);
              piVar26 = (int *)((long)pvVar29 + lVar28 * 4 + lVar25 * -4 + 4);
              *piVar26 = *piVar26 + iVar20;
            }
            lVar28 = lVar28 + 1;
            iVar19 = iVar19 + 1;
          } while (lVar28 < (int)uVar22);
        }
      }
      if (((uVar45 <= uVar24) &&
          (*(undefined4 *)((long)pvVar29 + lVar51 * 4 + lVar25 * -4) = 10000000,
          *(int *)(lVar27 + lVar51 * 4) != 10000000)) &&
         (uVar17 = (*evaluate)(i,uVar45,i,uVar45,'\x0e',&local_70), uVar17 != '\0')) {
        uVar22 = vrna_get_ptype_window(i,uVar45,ppcVar10);
        if ((int)uVar23 < 0) {
          iVar20 = 0;
        }
        else {
          iVar20 = pvVar8->dangle5[uVar22][uVar23];
        }
        if (2 < uVar22) {
          iVar20 = iVar20 + pvVar8->TerminalAU;
        }
        *(int *)((long)pvVar29 + lVar51 * 4 + lVar25 * -4) = iVar20 + *(int *)(lVar27 + lVar51 * 4);
        if ((code *)puVar15 != (code *)0x0) {
          iVar20 = (*(code *)puVar15)(uVar53,uVar53,uVar52,&local_e8);
          piVar26 = (int *)((long)pvVar29 + lVar51 * 4 + lVar25 * -4);
          *piVar26 = *piVar26 + iVar20;
        }
      }
    }
    else if (fc->type == VRNA_FC_TYPE_COMPARATIVE) {
      uVar23 = (fc->field_23).field_1.n_seq;
      uVar37 = (ulong)uVar23;
      pcVar12 = (fc->field_23).field_0.ptype_pf_compat;
      pvVar5 = (fc->field_23).field_0.sc;
      ppsVar13 = (fc->field_23).field_1.S3;
      ppuVar14 = (fc->field_23).field_1.a2s;
      uVar24 = iVar18 + i;
      uVar22 = uVar45 - 1;
      if ((int)uVar24 < (int)uVar45) {
        uVar22 = uVar24;
      }
      uVar23 = uVar23 * 2;
      pvVar30 = vrna_alloc(uVar23);
      pvVar31 = vrna_alloc(uVar23);
      if (uVar37 != 0) {
        uVar32 = 0;
        do {
          uVar33 = 0xffff;
          if (1 < ppuVar14[uVar32][lVar25]) {
            uVar33 = *(undefined2 *)(*(long *)(&pvVar5->type + uVar32 * 2) + lVar25 * 2);
          }
          *(undefined2 *)((long)pvVar30 + uVar32 * 2) = uVar33;
          *(undefined2 *)((long)pvVar31 + uVar32 * 2) =
               *(undefined2 *)(*(long *)(pcVar12 + uVar32 * 8) + lVar25 * 2);
          uVar32 = uVar32 + 1;
        } while (uVar37 != uVar32);
      }
      iVar20 = iVar20 + iVar48;
      if (iVar20 <= (int)uVar22) {
        lVar43 = (long)iVar20;
        do {
          *(undefined4 *)((long)pvVar29 + lVar43 * 4 + lVar25 * -4) = 10000000;
          if ((*(int *)(lVar27 + lVar43 * 4) != 10000000) &&
             (uVar17 = (*evaluate)(i,uVar45,(int)lVar43,(int)lVar43 + 1,'\x10',&local_70),
             uVar17 != '\0')) {
            iVar19 = *(int *)(lVar27 + lVar43 * 4);
            if (uVar37 != 0) {
              uVar32 = 0;
              do {
                uVar23 = vrna_get_ptype_md((int)*(short *)((long)pvVar31 + uVar32 * 2),
                                           (int)*(short *)(*(long *)(pcVar12 + uVar32 * 8) +
                                                          lVar43 * 2),&pvVar8->model_details);
                puVar11 = ppuVar14[uVar32];
                uVar41 = 0xffffffff;
                if (puVar11[lVar43] < puVar11[uVar52]) {
                  uVar41 = (uint)ppsVar13[uVar32][lVar43];
                }
                sVar3 = *(short *)((long)pvVar30 + uVar32 * 2);
                uVar39 = (uint)sVar3;
                if ((int)(uVar41 | uVar39) < 0) {
                  if (-1 < sVar3) {
                    piVar26 = pvVar8->dangle5[uVar23] + uVar39;
                    goto LAB_0011c914;
                  }
                  paaiVar47 = (int (*) [5] [5])pvVar8->dangle3;
                  uVar39 = uVar23;
                  if (-1 < (int)uVar41) goto LAB_0011c8ed;
                  iVar50 = 0;
                }
                else {
                  paaiVar47 = pvVar8->mismatchExt + uVar23;
LAB_0011c8ed:
                  piVar26 = (*paaiVar47)[uVar39] + uVar41;
LAB_0011c914:
                  iVar50 = *piVar26;
                }
                if (2 < uVar23) {
                  iVar50 = iVar50 + pvVar8->TerminalAU;
                }
                iVar19 = iVar19 + iVar50;
                uVar32 = uVar32 + 1;
              } while (uVar37 != uVar32);
            }
            *(int *)((long)pvVar29 + lVar43 * 4 + lVar25 * -4) = iVar19;
          }
          bVar57 = lVar43 < (int)uVar22;
          lVar43 = lVar43 + 1;
        } while (bVar57);
        if ((code *)puVar16 != (code *)0x0) {
          lVar43 = (long)iVar20 + -1;
          do {
            if (*(int *)((long)pvVar29 + lVar43 * 4 + lVar25 * -4 + 4) != 10000000) {
              iVar19 = (*(code *)puVar16)(uVar53,iVar20,iVar20 + 1,&local_e8);
              piVar26 = (int *)((long)pvVar29 + lVar43 * 4 + lVar25 * -4 + 4);
              *piVar26 = *piVar26 + iVar19;
            }
            lVar43 = lVar43 + 1;
            iVar20 = iVar20 + 1;
          } while (lVar43 < (int)uVar22);
        }
      }
      if (((uVar45 <= uVar24) &&
          (*(undefined4 *)((long)pvVar29 + lVar51 * 4 + lVar25 * -4) = 10000000,
          *(int *)(lVar27 + lVar51 * 4) != 10000000)) &&
         (uVar17 = (*evaluate)(i,uVar45,i,uVar45,'\x0e',&local_70), uVar17 != '\0')) {
        iVar20 = *(int *)(lVar27 + lVar51 * 4);
        if (uVar37 != 0) {
          uVar32 = 0;
          do {
            uVar23 = vrna_get_ptype_md((int)*(short *)((long)pvVar31 + uVar32 * 2),
                                       (int)*(short *)(*(long *)(pcVar12 + uVar32 * 8) + lVar51 * 2)
                                       ,&pvVar8->model_details);
            lVar43 = (long)*(short *)((long)pvVar30 + uVar32 * 2);
            iVar19 = 0;
            if (-1 < lVar43) {
              iVar19 = pvVar8->dangle5[uVar23][lVar43];
            }
            if (2 < uVar23) {
              iVar19 = iVar19 + pvVar8->TerminalAU;
            }
            iVar20 = iVar20 + iVar19;
            uVar32 = uVar32 + 1;
          } while (uVar37 != uVar32);
        }
        if ((code *)puVar15 != (code *)0x0) {
          iVar19 = (*(code *)puVar15)(uVar53,uVar53,uVar52,&local_e8);
          iVar20 = iVar20 + iVar19;
        }
        *(int *)((long)pvVar29 + lVar51 * 4 + lVar25 * -4) = iVar20;
      }
      free(pvVar30);
      free(pvVar31);
    }
    iVar18 = iVar18 + i;
    iVar20 = uVar45 - 1;
    if (iVar18 < (int)uVar45) {
      iVar20 = iVar18;
    }
    iVar19 = (fc->params->model_details).min_loop_size;
    iVar20 = vrna_fun_zip_add_min
                       ((int *)((long)pvVar29 + (long)iVar19 * 4 + 4),
                        (fc->matrices->field_2).field_0.f5 + lVar25 + (long)iVar19 + 2,
                        (iVar20 - iVar19) - i);
    if (((int)uVar45 <= iVar18) &&
       (iVar18 = *(int *)((long)pvVar29 + lVar51 * 4 + lVar25 * -4), iVar18 <= iVar20)) {
      iVar20 = iVar18;
    }
    free(pvVar29);
    if (local_10c < iVar20) {
      iVar20 = local_10c;
    }
    goto LAB_0011e769;
  }
  if (iVar20 == 0) {
    piVar26 = f3_get_stem_contributions_d0(fc,i,evaluate,&local_70,&local_e8);
    iVar18 = iVar18 + i;
    iVar20 = uVar45 - 1;
    if (iVar18 < (int)uVar45) {
      iVar20 = iVar18;
    }
    iVar19 = (fc->params->model_details).min_loop_size;
    iVar20 = vrna_fun_zip_add_min
                       (piVar26 + lVar25 + (long)iVar19 + 1,
                        (fc->matrices->field_2).field_0.f5 + lVar25 + (long)iVar19 + 2,
                        (iVar20 - iVar19) - i);
    if (((int)uVar45 <= iVar18) && (piVar26[lVar51] <= iVar20)) {
      iVar20 = piVar26[lVar51];
    }
    free(piVar26 + lVar25);
    if (local_10c < iVar20) {
      iVar20 = local_10c;
    }
    goto LAB_0011e769;
  }
  piVar26 = f3_get_stem_contributions_d0(fc,i,evaluate,&local_70,&local_e8);
  iVar18 = iVar18 + i;
  iVar20 = uVar45 - 1;
  if (iVar18 < (int)uVar45) {
    iVar20 = iVar18;
  }
  iVar19 = (fc->params->model_details).min_loop_size;
  iVar19 = vrna_fun_zip_add_min
                     (piVar26 + lVar25 + (long)iVar19 + 1,
                      (fc->matrices->field_2).field_0.f5 + lVar25 + (long)iVar19 + 2,
                      (iVar20 - iVar19) - i);
  if (((int)uVar45 <= iVar18) && (piVar26[lVar51] <= iVar19)) {
    iVar19 = piVar26[lVar51];
  }
  free(piVar26 + lVar25);
  uVar23 = fc->length;
  lVar27 = (long)(int)uVar23;
  iVar20 = fc->window_size;
  pvVar8 = fc->params;
  lVar43 = *(long *)((fc->matrices->field_2).field_0.c + lVar25 * 2);
  lVar28 = lVar43 + lVar25 * -4;
  iVar50 = (pvVar8->model_details).min_loop_size;
  pvVar29 = vrna_alloc(iVar20 * 4 + 0x18);
  puVar16 = local_e8.decomp_stem;
  puVar15 = local_e8.red_stem;
  if (fc->type == VRNA_FC_TYPE_COMPARATIVE) {
    uVar22 = (fc->field_23).field_1.n_seq;
    uVar52 = (ulong)uVar22;
    pcVar12 = (fc->field_23).field_0.ptype_pf_compat;
    ppsVar13 = (fc->field_23).field_1.S3;
    ppuVar14 = (fc->field_23).field_1.a2s;
    iVar40 = uVar23 - 1;
    iVar21 = iVar20 + i + 1;
    if ((int)uVar23 <= iVar21) {
      iVar21 = iVar40;
    }
    pvVar30 = vrna_alloc(uVar22 * 2);
    if (uVar52 != 0) {
      uVar32 = 0;
      do {
        *(undefined2 *)((long)pvVar30 + uVar32 * 2) =
             *(undefined2 *)(*(long *)(pcVar12 + uVar32 * 8) + lVar25 * 2);
        uVar32 = uVar32 + 1;
      } while (uVar52 != uVar32);
    }
    iVar50 = iVar50 + iVar48;
    if (iVar50 <= iVar21) {
      lVar43 = (long)iVar50;
      do {
        *(undefined4 *)((long)pvVar29 + lVar43 * 4 + lVar25 * -4) = 10000000;
        if ((*(int *)(lVar28 + -4 + lVar43 * 4) != 10000000) &&
           (uVar17 = (*evaluate)(i,uVar23,(int)lVar43 + -1,(int)lVar43 + 1,'\x10',&local_70),
           uVar17 != '\0')) {
          iVar34 = *(int *)(lVar28 + -4 + lVar43 * 4);
          if (uVar52 != 0) {
            uVar32 = 0;
            do {
              uVar22 = vrna_get_ptype_md((int)*(short *)((long)pvVar30 + uVar32 * 2),
                                         (int)*(short *)(*(long *)(pcVar12 + uVar32 * 8) + -2 +
                                                        lVar43 * 2),&pvVar8->model_details);
              puVar11 = ppuVar14[uVar32];
              iVar35 = 0;
              if ((puVar11[lVar43 + -1] < puVar11[lVar27]) &&
                 (lVar54 = (long)ppsVar13[uVar32][lVar43 + -1], iVar35 = 0, -1 < lVar54)) {
                iVar35 = pvVar8->dangle3[uVar22][lVar54];
              }
              if (2 < uVar22) {
                iVar35 = iVar35 + pvVar8->TerminalAU;
              }
              iVar34 = iVar34 + iVar35;
              uVar32 = uVar32 + 1;
            } while (uVar52 != uVar32);
          }
          *(int *)((long)pvVar29 + lVar43 * 4 + lVar25 * -4) = iVar34;
        }
        bVar57 = lVar43 < iVar21;
        lVar43 = lVar43 + 1;
      } while (bVar57);
      if ((code *)puVar16 != (code *)0x0) {
        uVar32 = (long)iVar50 - 1;
        do {
          if (*(int *)((long)pvVar29 + uVar32 * 4 + lVar25 * -4 + 4) != 10000000) {
            iVar50 = (*(code *)puVar16)(uVar53,uVar32 & 0xffffffff,(int)uVar32 + 2,&local_e8);
            piVar26 = (int *)((long)pvVar29 + uVar32 * 4 + lVar25 * -4 + 4);
            *piVar26 = *piVar26 + iVar50;
          }
          uVar32 = uVar32 + 1;
        } while ((long)uVar32 < (long)iVar21);
      }
    }
    if ((((int)uVar23 <= iVar20 + i) && (*(int *)(lVar28 + -4 + lVar27 * 4) != 10000000)) &&
       (uVar17 = (*evaluate)(i,uVar23,i,iVar40,'\x0e',&local_70), uVar17 != '\0')) {
      iVar20 = *(int *)(lVar28 + -4 + lVar27 * 4);
      if (uVar52 != 0) {
        uVar32 = 0;
        do {
          uVar23 = vrna_get_ptype_md((int)*(short *)((long)pvVar30 + uVar32 * 2),
                                     (int)*(short *)(*(long *)(pcVar12 + uVar32 * 8) + -2 +
                                                    lVar27 * 2),&pvVar8->model_details);
          puVar11 = ppuVar14[uVar32];
          iVar50 = 0;
          if (puVar11[lVar27 + -1] < puVar11[lVar27]) {
            lVar43 = (long)ppsVar13[uVar32][lVar27 + -1];
            iVar50 = 0;
            if (-1 < lVar43) {
              iVar50 = pvVar8->dangle3[uVar23][lVar43];
            }
          }
          if (2 < uVar23) {
            iVar50 = iVar50 + pvVar8->TerminalAU;
          }
          iVar20 = iVar20 + iVar50;
          uVar32 = uVar32 + 1;
        } while (uVar52 != uVar32);
      }
      if ((code *)puVar15 != (code *)0x0) {
        iVar50 = (*(code *)puVar15)(uVar53,uVar53,iVar40,&local_e8);
        iVar20 = iVar20 + iVar50;
      }
      *(int *)((long)pvVar29 + lVar27 * 4 + lVar25 * -4) = iVar20;
    }
    free(pvVar30);
  }
  else if (fc->type == VRNA_FC_TYPE_SINGLE) {
    psVar9 = (fc->field_23).field_0.sequence_encoding;
    ppcVar10 = fc->ptype_local;
    iVar40 = uVar23 - 1;
    iVar21 = iVar20 + i + 1;
    if ((int)uVar23 <= iVar21) {
      iVar21 = iVar40;
    }
    if (iVar48 + iVar50 <= iVar21) {
      lVar54 = (long)(iVar48 + iVar50);
      uVar52 = lVar54 - 1;
      lVar55 = lVar54 * 4 + lVar25 * -4;
      lVar56 = lVar55 + lVar43 + -4;
      lVar43 = 0;
      do {
        *(undefined4 *)((long)pvVar29 + lVar43 * 4 + lVar55) = 10000000;
        if (*(int *)(lVar56 + lVar43 * 4) != 10000000) {
          iVar34 = iVar50 + i + (int)lVar43;
          uVar17 = (*evaluate)(i,uVar23,iVar34,iVar34 + 2,'\x10',&local_70);
          if (uVar17 != '\0') {
            uVar22 = vrna_get_ptype_window(i,iVar34,ppcVar10);
            lVar38 = (long)psVar9[lVar54 + lVar43];
            if (lVar38 < 0) {
              iVar34 = 0;
            }
            else {
              iVar34 = pvVar8->dangle3[uVar22][lVar38];
            }
            if (2 < uVar22) {
              iVar34 = iVar34 + pvVar8->TerminalAU;
            }
            *(int *)((long)pvVar29 + lVar43 * 4 + lVar55) = iVar34 + *(int *)(lVar56 + lVar43 * 4);
          }
        }
        lVar38 = lVar43 + 1;
        lVar43 = lVar43 + 1;
      } while ((long)(lVar38 + uVar52) < (long)iVar21);
      if ((code *)puVar16 != (code *)0x0) {
        do {
          if (*(int *)((long)pvVar29 + uVar52 * 4 + lVar25 * -4 + 4) != 10000000) {
            iVar50 = (*(code *)puVar16)(uVar53,uVar52 & 0xffffffff,(int)uVar52 + 2,&local_e8);
            piVar26 = (int *)((long)pvVar29 + uVar52 * 4 + lVar25 * -4 + 4);
            *piVar26 = *piVar26 + iVar50;
          }
          uVar52 = uVar52 + 1;
        } while ((long)uVar52 < (long)iVar21);
      }
    }
    if ((((int)uVar23 <= iVar20 + i) && (*(int *)(lVar28 + -4 + lVar27 * 4) != 10000000)) &&
       (uVar17 = (*evaluate)(i,uVar23,i,iVar40,'\x0e',&local_70), uVar17 != '\0')) {
      uVar23 = vrna_get_ptype_window(i,iVar40,ppcVar10);
      lVar43 = (long)psVar9[lVar27];
      if (lVar43 < 0) {
        iVar20 = 0;
      }
      else {
        iVar20 = pvVar8->dangle3[uVar23][lVar43];
      }
      if (2 < uVar23) {
        iVar20 = iVar20 + pvVar8->TerminalAU;
      }
      *(int *)((long)pvVar29 + lVar27 * 4 + lVar25 * -4) =
           iVar20 + *(int *)(lVar28 + -4 + lVar27 * 4);
      if ((code *)puVar15 != (code *)0x0) {
        iVar20 = (*(code *)puVar15)(uVar53,uVar53,iVar40,&local_e8);
        piVar26 = (int *)((long)pvVar29 + lVar27 * 4 + lVar25 * -4);
        *piVar26 = *piVar26 + iVar20;
      }
    }
  }
  iVar50 = uVar45 - 1;
  if (iVar18 + 1 < (int)uVar45) {
    iVar50 = iVar18 + 1;
  }
  iVar20 = (fc->params->model_details).min_loop_size;
  iVar20 = vrna_fun_zip_add_min
                     ((int *)((long)pvVar29 + (long)iVar20 * 4 + 4),
                      (fc->matrices->field_2).field_0.f5 + lVar25 + (long)iVar20 + 2,
                      (iVar50 - iVar20) - i);
  if (((int)uVar45 <= iVar18) &&
     (iVar21 = *(int *)((long)pvVar29 + lVar51 * 4 + lVar25 * -4), iVar21 <= iVar20)) {
    iVar20 = iVar21;
  }
  free(pvVar29);
  uVar23 = fc->length;
  lVar28 = (long)(int)uVar23;
  iVar21 = fc->window_size;
  pvVar8 = fc->params;
  lVar43 = *(long *)((fc->matrices->field_2).field_0.c + uVar37 * 2);
  lVar27 = lVar43 + uVar37 * -4;
  iVar40 = (pvVar8->model_details).min_loop_size;
  pvVar29 = vrna_alloc(iVar21 * 4 + 0x18);
  puVar16 = local_e8.decomp_stem1;
  puVar15 = local_e8.red_stem;
  if (fc->type == VRNA_FC_TYPE_COMPARATIVE) {
    uVar22 = (fc->field_23).field_1.n_seq;
    uVar52 = (ulong)uVar22;
    pcVar12 = (fc->field_23).field_0.ptype_pf_compat;
    pvVar5 = (fc->field_23).field_0.sc;
    ppuVar14 = (fc->field_23).field_1.a2s;
    iVar35 = iVar21 + i + 1;
    iVar34 = uVar23 - 1;
    if (iVar35 < (int)uVar23) {
      iVar34 = iVar35;
    }
    uVar22 = uVar22 * 2;
    pvVar30 = vrna_alloc(uVar22);
    pvVar31 = vrna_alloc(uVar22);
    if (uVar52 != 0) {
      uVar32 = 0;
      do {
        uVar33 = 0xffff;
        if (1 < ppuVar14[uVar32][uVar37]) {
          uVar33 = *(undefined2 *)(*(long *)(&pvVar5->type + uVar32 * 2) + uVar37 * 2);
        }
        *(undefined2 *)((long)pvVar30 + uVar32 * 2) = uVar33;
        *(undefined2 *)((long)pvVar31 + uVar32 * 2) =
             *(undefined2 *)(*(long *)(pcVar12 + uVar32 * 8) + uVar37 * 2);
        uVar32 = uVar32 + 1;
      } while (uVar52 != uVar32);
    }
    iVar40 = iVar40 + iVar48;
    if (iVar40 <= iVar34) {
      lVar43 = (long)iVar40;
      do {
        *(undefined4 *)((long)pvVar29 + lVar43 * 4 + lVar25 * -4) = 10000000;
        if ((*(int *)(lVar27 + lVar43 * 4) != 10000000) &&
           (uVar17 = (*evaluate)(i,uVar23,(int)lVar43,(int)lVar43 + 1,'\x14',&local_70),
           uVar17 != '\0')) {
          iVar35 = *(int *)(lVar27 + lVar43 * 4);
          if (uVar52 != 0) {
            uVar32 = 0;
            do {
              uVar22 = vrna_get_ptype_md((int)*(short *)((long)pvVar31 + uVar32 * 2),
                                         (int)*(short *)(*(long *)(pcVar12 + uVar32 * 8) +
                                                        lVar43 * 2),&pvVar8->model_details);
              lVar54 = (long)*(short *)((long)pvVar30 + uVar32 * 2);
              if (lVar54 < 0) {
                iVar44 = 0;
              }
              else {
                iVar44 = pvVar8->dangle5[uVar22][lVar54];
              }
              if (2 < uVar22) {
                iVar44 = iVar44 + pvVar8->TerminalAU;
              }
              iVar35 = iVar35 + iVar44;
              uVar32 = uVar32 + 1;
            } while (uVar52 != uVar32);
          }
          *(int *)((long)pvVar29 + lVar43 * 4 + lVar25 * -4) = iVar35;
        }
        bVar57 = lVar43 < iVar34;
        lVar43 = lVar43 + 1;
      } while (bVar57);
      if ((code *)puVar16 != (code *)0x0) {
        lVar43 = (long)iVar40 + -1;
        do {
          if (*(int *)((long)pvVar29 + lVar43 * 4 + lVar25 * -4 + 4) != 10000000) {
            iVar35 = (*(code *)puVar16)(uVar53,iVar40,iVar40 + 1,&local_e8);
            piVar26 = (int *)((long)pvVar29 + lVar43 * 4 + lVar25 * -4 + 4);
            *piVar26 = *piVar26 + iVar35;
          }
          lVar43 = lVar43 + 1;
          iVar40 = iVar40 + 1;
        } while (lVar43 < iVar34);
      }
    }
    if ((((int)uVar23 <= iVar21 + i) &&
        (*(undefined4 *)((long)pvVar29 + lVar28 * 4 + lVar25 * -4) = 10000000,
        *(int *)(lVar27 + lVar28 * 4) != 10000000)) &&
       (uVar17 = (*evaluate)(i,uVar23,iVar48,uVar23,'\x0e',&local_70), uVar17 != '\0')) {
      iVar21 = *(int *)(lVar27 + lVar28 * 4);
      if (uVar52 != 0) {
        uVar32 = 0;
        do {
          uVar22 = vrna_get_ptype_md((int)*(short *)((long)pvVar31 + uVar32 * 2),
                                     (int)*(short *)(*(long *)(pcVar12 + uVar32 * 8) + lVar28 * 2),
                                     &pvVar8->model_details);
          lVar43 = (long)*(short *)((long)pvVar30 + uVar32 * 2);
          iVar40 = 0;
          if (-1 < lVar43) {
            iVar40 = pvVar8->dangle5[uVar22][lVar43];
          }
          if (2 < uVar22) {
            iVar40 = iVar40 + pvVar8->TerminalAU;
          }
          iVar21 = iVar21 + iVar40;
          uVar32 = uVar32 + 1;
        } while (uVar52 != uVar32);
      }
      if ((code *)puVar15 != (code *)0x0) {
        iVar40 = (*(code *)puVar15)(uVar53,uVar37,uVar23,&local_e8);
        iVar21 = iVar21 + iVar40;
      }
      *(int *)((long)pvVar29 + lVar28 * 4 + lVar25 * -4) = iVar21;
    }
    free(pvVar30);
    free(pvVar31);
  }
  else if (fc->type == VRNA_FC_TYPE_SINGLE) {
    ppcVar10 = fc->ptype_local;
    uVar1 = (fc->field_23).field_0.sequence_encoding[lVar25];
    iVar35 = iVar21 + i + 1;
    iVar34 = uVar23 - 1;
    if (iVar35 < (int)uVar23) {
      iVar34 = iVar35;
    }
    iVar35 = iVar40 + iVar48;
    if (iVar35 <= iVar34) {
      lVar54 = (long)iVar35 + -1;
      lVar55 = (long)iVar35 * 4;
      lVar43 = lVar43 + lVar55 + uVar37 * -4;
      lVar55 = lVar55 + lVar25 * -4;
      lVar56 = 0;
      do {
        *(undefined4 *)((long)pvVar29 + lVar56 * 4 + lVar55) = 10000000;
        if (*(int *)(lVar43 + lVar56 * 4) != 10000000) {
          iVar44 = iVar40 + i + (int)lVar56 + 1;
          uVar17 = (*evaluate)(i,uVar23,iVar44,iVar40 + i + 2 + (int)lVar56,'\x14',&local_70);
          if (uVar17 != '\0') {
            uVar22 = vrna_get_ptype_window(iVar48,iVar44,ppcVar10);
            if ((short)uVar1 < 0) {
              iVar44 = 0;
            }
            else {
              iVar44 = pvVar8->dangle5[uVar22][uVar1];
            }
            if (2 < uVar22) {
              iVar44 = iVar44 + pvVar8->TerminalAU;
            }
            *(int *)((long)pvVar29 + lVar56 * 4 + lVar55) = iVar44 + *(int *)(lVar43 + lVar56 * 4);
          }
        }
        lVar38 = lVar54 + lVar56;
        lVar56 = lVar56 + 1;
      } while (lVar38 + 1 < (long)iVar34);
      if ((code *)puVar16 != (code *)0x0) {
        do {
          if (*(int *)((long)pvVar29 + lVar54 * 4 + lVar25 * -4 + 4) != 10000000) {
            iVar40 = (*(code *)puVar16)(uVar53,iVar35,iVar35 + 1,&local_e8);
            piVar26 = (int *)((long)pvVar29 + lVar54 * 4 + lVar25 * -4 + 4);
            *piVar26 = *piVar26 + iVar40;
          }
          lVar54 = lVar54 + 1;
          iVar35 = iVar35 + 1;
        } while (lVar54 < iVar34);
      }
    }
    if ((((int)uVar23 <= iVar21 + i) &&
        (*(undefined4 *)((long)pvVar29 + lVar28 * 4 + lVar25 * -4) = 10000000,
        *(int *)(lVar27 + lVar28 * 4) != 10000000)) &&
       (uVar17 = (*evaluate)(i,uVar23,iVar48,uVar23,'\x0e',&local_70), uVar17 != '\0')) {
      uVar22 = vrna_get_ptype_window(iVar48,uVar23,ppcVar10);
      if ((short)uVar1 < 0) {
        iVar21 = 0;
      }
      else {
        iVar21 = pvVar8->dangle5[uVar22][uVar1];
      }
      if (2 < uVar22) {
        iVar21 = iVar21 + pvVar8->TerminalAU;
      }
      *(int *)((long)pvVar29 + lVar28 * 4 + lVar25 * -4) = iVar21 + *(int *)(lVar27 + lVar28 * 4);
      if ((code *)puVar15 != (code *)0x0) {
        iVar21 = (*(code *)puVar15)(uVar53,uVar37,uVar23,&local_e8);
        piVar26 = (int *)((long)pvVar29 + lVar28 * 4 + lVar25 * -4);
        *piVar26 = *piVar26 + iVar21;
      }
    }
  }
  iVar21 = (fc->params->model_details).min_loop_size;
  local_78 = vrna_fun_zip_add_min
                       ((int *)((long)pvVar29 + (long)iVar21 * 4 + 4),
                        (fc->matrices->field_2).field_0.f5 + lVar25 + (long)iVar21 + 2,
                        (iVar50 - iVar21) - i);
  if (((int)uVar45 <= iVar18) &&
     (iVar21 = *(int *)((long)pvVar29 + lVar51 * 4 + lVar25 * -4), iVar21 <= local_78)) {
    local_78 = iVar21;
  }
  free(pvVar29);
  uVar23 = fc->length;
  lVar28 = (long)(int)uVar23;
  iVar21 = fc->window_size;
  pvVar8 = fc->params;
  lVar27 = *(long *)((fc->matrices->field_2).field_0.c + uVar37 * 2);
  lVar43 = lVar27 + uVar37 * -4;
  iVar40 = (pvVar8->model_details).min_loop_size;
  pvVar29 = vrna_alloc(iVar21 * 4 + 0x18);
  puVar15 = local_e8.decomp_stem1;
  local_80 = (code *)local_e8.red_stem;
  if (fc->type == VRNA_FC_TYPE_COMPARATIVE) {
    uVar22 = (fc->field_23).field_1.n_seq;
    uVar52 = (ulong)uVar22;
    pcVar12 = (fc->field_23).field_0.ptype_pf_compat;
    pvVar5 = (fc->field_23).field_0.sc;
    ppsVar13 = (fc->field_23).field_1.S3;
    ppuVar14 = (fc->field_23).field_1.a2s;
    iVar35 = uVar23 - 1;
    iVar34 = iVar21 + i + 1;
    if ((int)uVar23 <= iVar34) {
      iVar34 = iVar35;
    }
    uVar22 = uVar22 * 2;
    pvVar30 = vrna_alloc(uVar22);
    pvVar31 = vrna_alloc(uVar22);
    if (uVar52 != 0) {
      uVar32 = 0;
      do {
        uVar33 = 0xffff;
        if (1 < ppuVar14[uVar32][uVar37]) {
          uVar33 = *(undefined2 *)(*(long *)(&pvVar5->type + uVar32 * 2) + uVar37 * 2);
        }
        *(undefined2 *)((long)pvVar30 + uVar32 * 2) = uVar33;
        *(undefined2 *)((long)pvVar31 + uVar32 * 2) =
             *(undefined2 *)(*(long *)(pcVar12 + uVar32 * 8) + uVar37 * 2);
        uVar32 = uVar32 + 1;
      } while (uVar52 != uVar32);
    }
    iVar40 = iVar40 + iVar48;
    if (iVar40 <= iVar34) {
      lVar27 = (long)iVar40;
      do {
        *(undefined4 *)((long)pvVar29 + lVar27 * 4 + lVar25 * -4) = 10000000;
        if ((*(int *)(lVar43 + -4 + lVar27 * 4) != 10000000) &&
           (uVar17 = (*evaluate)(i,uVar23,(int)lVar27 + -1,(int)lVar27 + 1,'\x14',&local_70),
           uVar17 != '\0')) {
          iVar44 = *(int *)(lVar43 + -4 + lVar27 * 4);
          if (uVar52 != 0) {
            uVar32 = 0;
            do {
              uVar22 = vrna_get_ptype_md((int)*(short *)((long)pvVar31 + uVar32 * 2),
                                         (int)*(short *)(*(long *)(pcVar12 + uVar32 * 8) + -2 +
                                                        lVar27 * 2),&pvVar8->model_details);
              uVar24 = 0xffffffff;
              if (ppuVar14[uVar32][lVar27 + -1] < ppuVar14[uVar32][lVar28]) {
                uVar24 = (uint)ppsVar13[uVar32][lVar27 + -1];
              }
              sVar3 = *(short *)((long)pvVar30 + uVar32 * 2);
              uVar41 = (uint)sVar3;
              if ((int)(uVar24 | uVar41) < 0) {
                if (-1 < sVar3) {
                  piVar26 = pvVar8->dangle5[uVar22] + uVar41;
                  goto LAB_0011e2fa;
                }
                paaiVar47 = (int (*) [5] [5])pvVar8->dangle3;
                uVar41 = uVar22;
                if (-1 < (int)uVar24) goto LAB_0011e2d3;
                iVar36 = 0;
              }
              else {
                paaiVar47 = pvVar8->mismatchExt + uVar22;
LAB_0011e2d3:
                piVar26 = (*paaiVar47)[uVar41] + uVar24;
LAB_0011e2fa:
                iVar36 = *piVar26;
              }
              if (2 < uVar22) {
                iVar36 = iVar36 + pvVar8->TerminalAU;
              }
              iVar44 = iVar44 + iVar36;
              uVar32 = uVar32 + 1;
            } while (uVar52 != uVar32);
          }
          *(int *)((long)pvVar29 + lVar27 * 4 + lVar25 * -4) = iVar44;
        }
        bVar57 = lVar27 < iVar34;
        lVar27 = lVar27 + 1;
      } while (bVar57);
      if ((code *)puVar15 != (code *)0x0) {
        uVar32 = (long)iVar40 - 1;
        do {
          if (*(int *)((long)pvVar29 + uVar32 * 4 + lVar25 * -4 + 4) != 10000000) {
            iVar40 = (*(code *)puVar15)(uVar53,uVar32 & 0xffffffff,(int)uVar32 + 2,&local_e8);
            piVar26 = (int *)((long)pvVar29 + uVar32 * 4 + lVar25 * -4 + 4);
            *piVar26 = *piVar26 + iVar40;
          }
          uVar32 = uVar32 + 1;
        } while ((long)uVar32 < (long)iVar34);
      }
    }
    if ((((int)uVar23 <= iVar21 + i) && (*(int *)(lVar43 + -4 + lVar28 * 4) != 10000000)) &&
       (uVar17 = (*evaluate)(i,uVar23,iVar48,iVar35,'\x0e',&local_70), uVar17 != '\0')) {
      iVar21 = *(int *)(lVar43 + -4 + lVar28 * 4);
      if (uVar52 != 0) {
        uVar32 = 0;
        do {
          uVar23 = vrna_get_ptype_md((int)*(short *)((long)pvVar31 + uVar32 * 2),
                                     (int)*(short *)(*(long *)(pcVar12 + uVar32 * 8) + -2 +
                                                    lVar28 * 2),&pvVar8->model_details);
          uVar22 = 0xffffffff;
          if (ppuVar14[uVar32][lVar28 + -1] < ppuVar14[uVar32][lVar28]) {
            uVar22 = (uint)ppsVar13[uVar32][lVar28 + -1];
          }
          sVar3 = *(short *)((long)pvVar30 + uVar32 * 2);
          uVar24 = (uint)sVar3;
          if ((int)(uVar22 | uVar24) < 0) {
            if (-1 < sVar3) {
              piVar26 = pvVar8->dangle5[uVar23] + uVar24;
              goto LAB_0011e4c9;
            }
            paaiVar47 = (int (*) [5] [5])pvVar8->dangle3;
            uVar24 = uVar23;
            if (-1 < (int)uVar22) goto LAB_0011e4aa;
            iVar40 = 0;
          }
          else {
            paaiVar47 = pvVar8->mismatchExt + uVar23;
LAB_0011e4aa:
            piVar26 = (*paaiVar47)[uVar24] + uVar22;
LAB_0011e4c9:
            iVar40 = *piVar26;
          }
          if (2 < uVar23) {
            iVar40 = iVar40 + pvVar8->TerminalAU;
          }
          iVar21 = iVar21 + iVar40;
          uVar32 = uVar32 + 1;
        } while (uVar52 != uVar32);
      }
      if (local_80 != (code *)0x0) {
        iVar40 = (*local_80)(uVar53,uVar37,iVar35,&local_e8);
        iVar21 = iVar21 + iVar40;
      }
      *(int *)((long)pvVar29 + lVar28 * 4 + lVar25 * -4) = iVar21;
    }
    free(pvVar30);
    free(pvVar31);
  }
  else if (fc->type == VRNA_FC_TYPE_SINGLE) {
    psVar9 = (fc->field_23).field_0.sequence_encoding;
    ppcVar10 = fc->ptype_local;
    uVar1 = psVar9[lVar25];
    uVar22 = (uint)(short)uVar1;
    iVar35 = uVar23 - 1;
    iVar34 = iVar21 + i + 1;
    if ((int)uVar23 <= iVar34) {
      iVar34 = iVar35;
    }
    if (iVar48 + iVar40 <= iVar34) {
      local_38 = pvVar8->dangle3;
      lVar55 = (long)(iVar48 + iVar40);
      uVar52 = lVar55 - 1;
      lVar54 = lVar55 * 4 + uVar37 * -4 + lVar27 + -4;
      lVar56 = lVar55 * 4 + lVar25 * -4;
      lVar27 = 0;
      do {
        *(undefined4 *)((long)pvVar29 + lVar27 * 4 + lVar56) = 10000000;
        if (*(int *)(lVar54 + lVar27 * 4) != 10000000) {
          iVar44 = iVar40 + i + (int)lVar27;
          uVar17 = (*evaluate)(i,uVar23,iVar44,iVar44 + 2,'\x14',&local_70);
          if (uVar17 != '\0') {
            uVar24 = vrna_get_ptype_window(iVar48,iVar44,ppcVar10);
            uVar2 = psVar9[lVar55 + lVar27];
            if ((short)(uVar2 | uVar1) < 0) {
              if (-1 < (short)uVar1) {
                piVar26 = pvVar8->dangle5[uVar24] + uVar22;
                goto LAB_0011e084;
              }
              if (-1 < (short)uVar2) {
                paiVar42 = local_38 + uVar24;
                goto LAB_0011e061;
              }
              iVar44 = 0;
            }
            else {
              paiVar42 = pvVar8->mismatchExt[uVar24] + uVar22;
LAB_0011e061:
              piVar26 = *paiVar42 + (uint)(int)(short)uVar2;
LAB_0011e084:
              iVar44 = *piVar26;
            }
            if (2 < uVar24) {
              iVar44 = iVar44 + pvVar8->TerminalAU;
            }
            *(int *)((long)pvVar29 + lVar27 * 4 + lVar56) = iVar44 + *(int *)(lVar54 + lVar27 * 4);
          }
        }
        lVar38 = uVar52 + lVar27;
        lVar27 = lVar27 + 1;
      } while (lVar38 + 1 < (long)iVar34);
      if ((code *)puVar15 != (code *)0x0) {
        do {
          if (*(int *)((long)pvVar29 + uVar52 * 4 + lVar25 * -4 + 4) != 10000000) {
            iVar40 = (*(code *)puVar15)(uVar53,uVar52 & 0xffffffff,(int)uVar52 + 2,&local_e8);
            piVar26 = (int *)((long)pvVar29 + uVar52 * 4 + lVar25 * -4 + 4);
            *piVar26 = *piVar26 + iVar40;
          }
          uVar52 = uVar52 + 1;
        } while ((long)uVar52 < (long)iVar34);
      }
    }
    if ((((int)uVar23 <= iVar21 + i) && (*(int *)(lVar43 + -4 + lVar28 * 4) != 10000000)) &&
       (uVar17 = (*evaluate)(i,uVar23,iVar48,iVar35,'\x0e',&local_70), uVar17 != '\0')) {
      uVar23 = vrna_get_ptype_window(iVar48,iVar35,ppcVar10);
      uVar2 = psVar9[lVar28];
      if ((short)(uVar2 | uVar1) < 0) {
        if (-1 < (short)uVar1) {
          piVar26 = pvVar8->dangle5[uVar23] + uVar22;
          goto LAB_0011e870;
        }
        if (-1 < (short)uVar2) {
          piVar26 = pvVar8->dangle3[uVar23] + (uint)(int)(short)uVar2;
          goto LAB_0011e870;
        }
        iVar21 = 0;
      }
      else {
        piVar26 = pvVar8->mismatchExt[uVar23][uVar22] + (uint)(int)(short)uVar2;
LAB_0011e870:
        iVar21 = *piVar26;
      }
      if (2 < uVar23) {
        iVar21 = iVar21 + pvVar8->TerminalAU;
      }
      *(int *)((long)pvVar29 + lVar28 * 4 + lVar25 * -4) =
           iVar21 + *(int *)(lVar43 + -4 + lVar28 * 4);
      if (local_80 != (code *)0x0) {
        iVar21 = (*local_80)(uVar53,uVar37,iVar35,&local_e8);
        piVar26 = (int *)((long)pvVar29 + lVar28 * 4 + lVar25 * -4);
        *piVar26 = *piVar26 + iVar21;
      }
    }
  }
  iVar21 = (fc->params->model_details).min_loop_size;
  iVar50 = vrna_fun_zip_add_min
                     ((int *)((long)pvVar29 + (long)iVar21 * 4 + 4),
                      (fc->matrices->field_2).field_0.f5 + lVar25 + (long)iVar21 + 2,
                      (iVar50 - iVar21) - i);
  if (((int)uVar45 <= iVar18) &&
     (iVar18 = *(int *)((long)pvVar29 + lVar51 * 4 + lVar25 * -4), iVar18 <= iVar50)) {
    iVar50 = iVar18;
  }
  if (iVar19 < iVar20) {
    iVar20 = iVar19;
  }
  if (local_78 <= iVar20) {
    iVar20 = local_78;
  }
  free(pvVar29);
  if (iVar50 <= iVar20) {
    iVar20 = iVar50;
  }
  if (local_10c <= iVar20) {
    iVar20 = local_10c;
  }
  if (9999999 < iVar20) {
    iVar20 = 10000000;
  }
LAB_0011e769:
  if (local_74 != 0) {
    uVar45 = fc->length;
    iVar48 = iVar48 + (fc->params->model_details).min_loop_size;
    lVar51 = *(long *)((fc->matrices->field_2).field_0.fc + lVar25 * 2);
    lVar43 = fc->window_size + lVar25;
    iVar18 = 10000000;
    iVar19 = (int)lVar43;
    if ((iVar48 < (int)uVar45) && (iVar48 <= iVar19)) {
      lVar27 = (long)iVar48;
      do {
        iVar48 = (fc->matrices->field_2).field_0.f5[lVar27 + 1];
        if (((iVar48 != 10000000) &&
            (iVar50 = *(int *)(lVar51 + lVar25 * -4 + lVar27 * 4), iVar50 != 10000000)) &&
           (iVar50 = iVar50 + iVar48, iVar50 <= iVar18)) {
          iVar18 = iVar50;
        }
      } while ((lVar27 + 1 < (long)(int)uVar45) &&
              (bVar57 = lVar27 < lVar43, lVar27 = lVar27 + 1, bVar57));
    }
    if (((int)uVar45 <= iVar19) &&
       (iVar48 = *(int *)(lVar51 + (long)(int)(uVar45 - i) * 4), iVar48 <= iVar18)) {
      iVar18 = iVar48;
    }
    if (iVar18 <= iVar20) {
      iVar20 = iVar18;
    }
  }
  free(local_e8.up_comparative);
  free(local_e8.user_cb_comparative);
  free(local_e8.user_data_comparative);
  return iVar20;
}

Assistant:

PUBLIC int
vrna_E_ext_loop_3(vrna_fold_compound_t  *fc,
                  int                   i)
{
  if (fc) {
    int                       e, en, dangle_model, with_gquad;
    vrna_param_t              *P;
    vrna_md_t                 *md;
    vrna_callback_hc_evaluate *evaluate;
    struct default_data       hc_dat_local;
    struct sc_wrapper_f3      sc_wrapper;

    e = INF;

    P             = fc->params;
    md            = &(P->model_details);
    dangle_model  = md->dangles;
    with_gquad    = md->gquad;
    evaluate      = prepare_hc_default_window(fc, &hc_dat_local);

    init_sc_wrapper_f3(fc, i, &sc_wrapper);

    /* first case: i stays unpaired */
    e = reduce_f3_up(fc, i, evaluate, &hc_dat_local, &sc_wrapper);

    /* decompose into stem followed by exterior loop part */
    switch (dangle_model) {
      case 0:
        en  = decompose_f3_ext_stem_d0(fc, i, evaluate, &hc_dat_local, &sc_wrapper);
        e   = MIN2(e, en);
        break;

      case 2:
        en  = decompose_f3_ext_stem_d2(fc, i, evaluate, &hc_dat_local, &sc_wrapper);
        e   = MIN2(e, en);
        break;

      default:
        en  = decompose_f3_ext_stem_d1(fc, i, evaluate, &hc_dat_local, &sc_wrapper);
        e   = MIN2(e, en);
        break;
    }

    if (with_gquad) {
      en  = add_f3_gquad(fc, i, evaluate, &hc_dat_local, &sc_wrapper);
      e   = MIN2(e, en);
    }

    free_sc_wrapper_f3(&sc_wrapper);

    return e;
  }

  return INF;
}